

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int RunTool(int argCount,char **argValues)

{
  char *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar2;
  int iVar3;
  _Setprecision _Var4;
  ostream *poVar5;
  long lVar6;
  size_t __n;
  void *__buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_698;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_610;
  string local_5f8;
  undefined1 local_5d8 [8];
  gdscpp gdsfile_2;
  string local_510;
  string local_4f0;
  undefined1 local_4d0 [8];
  gdscpp gdsfile_1;
  undefined1 local_3f0 [8];
  gdscpp gdsfile;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0 [39];
  allocator<char> local_289;
  string local_288 [32];
  int local_268;
  allocator<char> local_261;
  int i_2;
  int local_240;
  undefined4 local_23c;
  int i_1;
  _Self local_230;
  allocator<char> local_221;
  string local_220 [36];
  int local_1fc;
  undefined1 local_1f8 [4];
  int i;
  string foo;
  string local_1d0 [8];
  string command;
  undefined1 local_1a8 [8];
  string gdsFName;
  string local_180 [8];
  string outFName;
  allocator<char> local_158;
  allocator<char> local_157;
  allocator<char> local_156;
  allocator<char> local_155 [20];
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  validCommands;
  char **argValues_local;
  int argCount_local;
  
  validCommands._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argValues;
  welcomeScreen();
  if (argCount < 2) {
    argValues_local._4_4_ = 0;
  }
  else {
    outFName.field_2._M_local_buf[0xd] = '\x01';
    local_140 = &local_138;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"-g",&local_141);
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_118,"-i",local_155);
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_f8,"-r",&local_156);
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d8,"-rw",&local_157);
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b8,"-rs",&local_158);
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_98,"-v",(allocator<char> *)(outFName.field_2._M_local_buf + 0xf));
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_78,"-h",(allocator<char> *)(outFName.field_2._M_local_buf + 0xe));
    outFName.field_2._M_local_buf[0xd] = '\0';
    local_58 = &local_138;
    local_50 = 7;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(outFName.field_2._M_local_buf + 0xb));
    __l._M_len = local_50;
    __l._M_array = local_58;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_48,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          (outFName.field_2._M_local_buf + 0xc),
          (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(outFName.field_2._M_local_buf + 0xb));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(outFName.field_2._M_local_buf + 0xb));
    local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
    do {
      local_698 = local_698 + -1;
      std::__cxx11::string::~string((string *)local_698);
    } while (local_698 != &local_138);
    std::allocator<char>::~allocator((allocator<char> *)(outFName.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(outFName.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator(&local_158);
    std::allocator<char>::~allocator(&local_157);
    std::allocator<char>::~allocator(&local_156);
    std::allocator<char>::~allocator(local_155);
    std::allocator<char>::~allocator(&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_180,"",(allocator<char> *)(gdsFName.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(gdsFName.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"",(allocator<char> *)(command.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(command.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_1d0,"",(allocator<char> *)(foo.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(foo.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)local_1f8);
    for (local_1fc = 0; local_1fc < argCount; local_1fc = local_1fc + 1) {
      pcVar1 = *(char **)(validCommands._M_t._M_impl.super__Rb_tree_header._M_node_count +
                         (long)local_1fc * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_220,pcVar1,&local_221);
      std::__cxx11::string::operator=((string *)local_1f8,local_220);
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator(&local_221);
      local_230._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48,(key_type *)local_1f8);
      _i_1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
      bVar2 = std::operator!=(&local_230,(_Self *)&i_1);
      if (bVar2) {
        std::__cxx11::string::operator=(local_1d0,(string *)local_1f8);
      }
    }
    iVar3 = std::__cxx11::string::compare((char *)local_1d0);
    if (iVar3 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Invalid.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      argValues_local._4_4_ = 0;
      local_23c = 1;
    }
    else {
      for (local_240 = 0; local_240 < argCount; local_240 = local_240 + 1) {
        pcVar1 = *(char **)(validCommands._M_t._M_impl.super__Rb_tree_header._M_node_count +
                           (long)local_240 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&i_2,pcVar1,&local_261);
        std::__cxx11::string::operator=((string *)local_1f8,(string *)&i_2);
        std::__cxx11::string::~string((string *)&i_2);
        std::allocator<char>::~allocator(&local_261);
        lVar6 = std::__cxx11::string::find(local_1f8,0x13105f);
        if ((lVar6 != -1) || (lVar6 = std::__cxx11::string::find(local_1f8,0x13103c), lVar6 != -1))
        {
          std::__cxx11::string::operator=((string *)local_1a8,(string *)local_1f8);
          local_240 = argCount;
        }
      }
      for (local_268 = 0; __n = (size_t)(argCount - 1U), local_268 < (int)(argCount - 1U);
          local_268 = local_268 + 1) {
        pcVar1 = *(char **)(validCommands._M_t._M_impl.super__Rb_tree_header._M_node_count +
                           (long)local_268 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_288,pcVar1,&local_289);
        iVar3 = std::__cxx11::string::compare((char *)local_288);
        std::__cxx11::string::~string(local_288);
        std::allocator<char>::~allocator(&local_289);
        if (iVar3 == 0) {
          pcVar1 = *(char **)(validCommands._M_t._M_impl.super__Rb_tree_header._M_node_count + 8 +
                             (long)local_268 * 8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_2b0,pcVar1,&local_2b1);
          std::__cxx11::string::operator=(local_180,local_2b0);
          std::__cxx11::string::~string(local_2b0);
          std::allocator<char>::~allocator(&local_2b1);
        }
      }
      iVar3 = std::__cxx11::string::compare((char *)local_180);
      if ((iVar3 == 0) && (iVar3 = std::__cxx11::string::compare((char *)local_1d0), iVar3 == 0)) {
        std::__cxx11::string::operator=(local_180,"data/results/gds/");
      }
      iVar3 = std::__cxx11::string::compare((char *)local_1d0);
      if (iVar3 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d8,"example1.gds",&local_2d9);
        example1(&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::allocator<char>::~allocator(&local_2d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_300,"example1.gds",&local_301);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_328,"example2.gds",
                   (allocator<char> *)
                   ((long)&gdsfile.STR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        example2(&local_300,&local_328);
        std::__cxx11::string::~string((string *)&local_328);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&gdsfile.STR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)&local_300);
        std::allocator<char>::~allocator(&local_301);
        argValues_local._4_4_ = 1;
        local_23c = 1;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_1d0);
        if (iVar3 == 0) {
          iVar3 = std::__cxx11::string::compare(local_1a8);
          if (iVar3 == 0) {
            poVar5 = std::operator<<((ostream *)&std::cout,"Input argument error.");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            argValues_local._4_4_ = 0;
            local_23c = 1;
          }
          else {
            gdsToText((string *)local_1a8);
            argValues_local._4_4_ = 1;
            local_23c = 1;
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_1d0);
          if (iVar3 == 0) {
            iVar3 = std::__cxx11::string::compare(local_1a8);
            if ((iVar3 == 0) ||
               (iVar3 = std::__cxx11::string::compare((char *)local_180), iVar3 == 0)) {
              poVar5 = std::operator<<((ostream *)&std::cout,"Input argument error.");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              argValues_local._4_4_ = 0;
              local_23c = 1;
            }
            else {
              gdscpp::gdscpp((gdscpp *)local_3f0);
              std::__cxx11::string::string
                        ((string *)
                         &gdsfile_1.STR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(string *)local_1a8);
              gdscpp::import((gdscpp *)local_3f0,
                             (string *)
                             &gdsfile_1.STR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::~string
                        ((string *)
                         &gdsfile_1.STR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              gdscpp::write((gdscpp *)local_3f0,(int)local_180,__buf,__n);
              argValues_local._4_4_ = 1;
              local_23c = 1;
              gdscpp::~gdscpp((gdscpp *)local_3f0);
            }
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)local_1d0);
            if (iVar3 == 0) {
              iVar3 = std::__cxx11::string::compare(local_1a8);
              if (iVar3 == 0) {
                poVar5 = std::operator<<((ostream *)&std::cout,"Input argument error.");
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                argValues_local._4_4_ = 0;
                local_23c = 1;
              }
              else {
                gdscpp::gdscpp((gdscpp *)local_4d0);
                std::__cxx11::string::string((string *)&local_4f0,(string *)local_1a8);
                gdscpp::import((gdscpp *)local_4d0,&local_4f0);
                std::__cxx11::string::~string((string *)&local_4f0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_510,"diagram.jpg",
                           (allocator<char> *)
                           ((long)&gdsfile_2.STR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                gdscpp::genDot((gdscpp *)local_4d0,&local_510);
                std::__cxx11::string::~string((string *)&local_510);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&gdsfile_2.STR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                argValues_local._4_4_ = 1;
                local_23c = 1;
                gdscpp::~gdscpp((gdscpp *)local_4d0);
              }
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)local_1d0);
              if (iVar3 == 0) {
                iVar3 = std::__cxx11::string::compare(local_1a8);
                if (iVar3 == 0) {
                  poVar5 = std::operator<<((ostream *)&std::cout,"Input argument error.");
                  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                  argValues_local._4_4_ = 0;
                  local_23c = 1;
                }
                else {
                  gdscpp::gdscpp((gdscpp *)local_5d8);
                  std::__cxx11::string::string((string *)&local_5f8,(string *)local_1a8);
                  gdscpp::import((gdscpp *)local_5d8,&local_5f8);
                  std::__cxx11::string::~string((string *)&local_5f8);
                  gdscpp::findRootSTR(&local_610,(gdscpp *)local_5d8);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_610);
                  argValues_local._4_4_ = 1;
                  local_23c = 1;
                  gdscpp::~gdscpp((gdscpp *)local_5d8);
                }
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)local_1d0);
                if (iVar3 == 0) {
                  if (argCount == 2) {
                    _Var4 = std::setprecision(2);
                    std::operator<<((ostream *)&std::cout,_Var4);
                    poVar5 = std::operator<<((ostream *)&std::cout,"Version: ");
                    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0.9);
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    argValues_local._4_4_ = 1;
                    local_23c = 1;
                  }
                  else {
                    poVar5 = std::operator<<((ostream *)&std::cout,"Input argument error.");
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    argValues_local._4_4_ = 0;
                    local_23c = 1;
                  }
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)local_1d0);
                  if (iVar3 == 0) {
                    helpScreen();
                    argValues_local._4_4_ = 1;
                    local_23c = 1;
                  }
                  else {
                    poVar5 = std::operator<<((ostream *)&std::cout,
                                             "Quickly catch the smoke before it escapes.");
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    argValues_local._4_4_ = 0;
                    local_23c = 1;
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::~string(local_180);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  }
  return argValues_local._4_4_;
}

Assistant:

int RunTool(int argCount, char **argValues)
{
  welcomeScreen();

  if (argCount <= 1) {
    return 0;
  }

  set<string> validCommands = {"-g", "-i", "-r", "-rw", "-rs", "-v", "-h"};

  string outFName =
      "\0"; // The output file, which is follow by the -o parameter
  string gdsFName = "\0"; // The GDS/GDS2 file
  string command = "\0";  // The command to be executed

  string foo;

  // search for command
  for (int i = 0; i < argCount; i++) {
    foo = string(argValues[i]);
    if (validCommands.find(foo) != validCommands.end()) {
      command = foo;
    }
  }
  if (!command.compare("\0")) {
    cout << "Invalid." << endl;
    return 0;
  }

  // search for gds/gsd2
  for (int i = 0; i < argCount; i++) {
    foo = string(argValues[i]);
    if (foo.find(".gds") != string::npos || foo.find(".gds2") != string::npos) {
      gdsFName = foo;
      i=argCount;
    }
  }

  // search for output filename
  for (int i = 0; i < argCount - 1; i++) {
    if (!string(argValues[i]).compare("-o")) {
      outFName = string(argValues[i + 1]);
    }
  }
  // auto assign output filename if non has been set
  if (!outFName.compare("\0")) {
    if (!command.compare("-g")) {
      outFName = outfileName;
    }
  }

  // Run the commands
  if (!command.compare("-g")) {
    // if (outFName.compare("\0")) {
    example1("example1.gds");
    example2("example1.gds", "example2.gds");
    return 1;
    // } else {
    //   cout << "Input argument error." << endl;
    //   return 0;
    // }
  } else if (!command.compare("-i")) {
    if (gdsFName.compare("\0")) {
      gdsToText(gdsFName);
      return 1;
    } else {
      cout << "Input argument error." << endl;
      return 0;
    }
  } else if (!command.compare("-rw")) {
    if (gdsFName.compare("\0") && outFName.compare("\0")) {
      gdscpp gdsfile;
      gdsfile.import(gdsFName);
      gdsfile.write(outFName);
      return 1;
    } else {
      cout << "Input argument error." << endl;
      return 0;
    }
  } else if (!command.compare("-r")) {
    if (gdsFName.compare("\0")) {
      gdscpp gdsfile;
      gdsfile.import(gdsFName);
      // gdsfile.createHierarchy();
      gdsfile.genDot("diagram.jpg");
      return 1;
    } else {
      cout << "Input argument error." << endl;
      return 0;
    }
  } else if (!command.compare("-rs")) {
    if (gdsFName.compare("\0")) {
      gdscpp gdsfile;
      gdsfile.import(gdsFName);
      gdsfile.findRootSTR();
      return 1;
    } else {
      cout << "Input argument error." << endl;
      return 0;
    }
  } else if (!command.compare("-v")) {
    if (argCount == 1 + 1) {
      cout << setprecision(2);
      cout << "Version: " << versionNo << endl;
      return 1;
    }
    cout << "Input argument error." << endl;
    return 0;
  } else if (!command.compare("-h")) {
    helpScreen();
    return 1;
  } else {
    cout << "Quickly catch the smoke before it escapes." << endl;
    return 0;
  }

  cout << "I am smelling smoke." << endl;
  return 0;
}